

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation_p.h
# Opt level: O0

void __thiscall QAbstractAnimationPrivate::emitDirectionChanged(QAbstractAnimationPrivate *this)

{
  QAbstractAnimationPrivate *in_RDI;
  Direction _t1;
  
  q_func(in_RDI);
  _t1 = (Direction)((ulong)in_RDI >> 0x20);
  ::QObjectCompatProperty::operator_cast_to_Direction
            ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
              *)0x66e62d);
  QAbstractAnimation::directionChanged((QAbstractAnimation *)0x66e639,_t1);
  return;
}

Assistant:

void emitDirectionChanged() { Q_EMIT q_func()->directionChanged(direction); }